

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__setsockopt_maybe_char(uv_udp_t *handle,int option,int val)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int arg;
  
  if ((uint)val < 0x100) {
    iVar3 = 0;
    arg = val;
    iVar1 = setsockopt((handle->io_watcher).fd,0,option,&arg,4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      iVar3 = -*piVar2;
    }
  }
  else {
    iVar3 = -0x16;
  }
  return iVar3;
}

Assistant:

static int uv__setsockopt_maybe_char(uv_udp_t* handle, int option, int val) {
#if defined(__sun)
  char arg = val;
#else
  int arg = val;
#endif

  if (val < 0 || val > 255)
    return -EINVAL;

  if (setsockopt(handle->io_watcher.fd, IPPROTO_IP, option, &arg, sizeof(arg)))
    return -errno;

  return 0;
}